

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_v3.cc
# Opt level: O1

int X509v3_get_ext_by_critical(stack_st_X509_EXTENSION *x,int crit,int lastpos)

{
  size_t sVar1;
  void *pvVar2;
  int iVar3;
  ulong uVar4;
  ulong i;
  bool bVar5;
  
  if (x == (stack_st_X509_EXTENSION *)0x0) {
LAB_0021eb57:
    iVar3 = -1;
  }
  else {
    sVar1 = OPENSSL_sk_num((OPENSSL_STACK *)x);
    if (lastpos < 0) {
      lastpos = 0xffffffff;
    }
    uVar4 = (ulong)(uint)lastpos;
    i = (ulong)lastpos;
    do {
      i = i + 1;
      if ((long)(int)sVar1 <= (long)i) goto LAB_0021eb57;
      pvVar2 = OPENSSL_sk_value((OPENSSL_STACK *)x,i);
      bVar5 = false;
      if (pvVar2 != (void *)0x0) {
        bVar5 = 0 < *(int *)((long)pvVar2 + 8);
      }
      bVar5 = bVar5 != (crit != 0);
      if (!bVar5) {
        uVar4 = i & 0xffffffff;
      }
      iVar3 = (int)uVar4;
    } while (bVar5);
  }
  return iVar3;
}

Assistant:

int X509v3_get_ext_by_critical(const STACK_OF(X509_EXTENSION) *sk, int crit,
                               int lastpos) {
  if (sk == NULL) {
    return -1;
  }

  lastpos++;
  if (lastpos < 0) {
    lastpos = 0;
  }

  crit = !!crit;
  int n = (int)sk_X509_EXTENSION_num(sk);
  for (; lastpos < n; lastpos++) {
    const X509_EXTENSION *ex = sk_X509_EXTENSION_value(sk, lastpos);
    if (X509_EXTENSION_get_critical(ex) == crit) {
      return lastpos;
    }
  }
  return -1;
}